

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint32_t __thiscall Cache::getTag(Cache *this,uint32_t addr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  byte bVar3;
  Cache *this_00;
  
  this_00 = this;
  uVar1 = log2i(this,(this->policy).blockSize);
  uVar2 = log2i(this_00,(this->policy).blockNum / (this->policy).associativity);
  bVar3 = (char)uVar1 + (char)uVar2;
  return addr >> (bVar3 & 0x1f) & ~(-1 << (-bVar3 & 0x1f));
}

Assistant:

uint32_t Cache::getTag(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << (32 - offsetBits - idBits)) - 1;
  return (addr >> (offsetBits + idBits)) & mask;
}